

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O2

void diy::
     Serialization<std::map<diy::Direction,_int,_std::less<diy::Direction>,_std::allocator<std::pair<const_diy::Direction,_int>_>_>_>
     ::load(BinaryBuffer *bb,Map *m)

{
  mapped_type *pmVar1;
  ulong uVar2;
  size_t s;
  Direction k;
  
  (*bb->_vptr_BinaryBuffer[4])(bb,&s,8);
  for (uVar2 = 0; uVar2 < s; uVar2 = uVar2 + 1) {
    Direction::Direction(&k);
    Serialization<diy::DynamicPoint<int,_4UL>_>::load(bb,(Point *)&k);
    pmVar1 = std::
             map<diy::Direction,_int,_std::less<diy::Direction>,_std::allocator<std::pair<const_diy::Direction,_int>_>_>
             ::operator[](m,(key_type *)&k);
    (*bb->_vptr_BinaryBuffer[4])(bb,pmVar1,4);
    itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::~small_vector
              ((small_vector<int,_4UL,_0UL,_std::allocator<int>_> *)&k);
  }
  return;
}

Assistant:

static void         load(BinaryBuffer& bb, Map& m)
    {
      size_t s;
      diy::load(bb, s);
      for (size_t i = 0; i < s; ++i)
      {
        K k;
        diy::load(bb, k);
        diy::load(bb, m[k]);
      }
    }